

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
libcellml::flattenUnitsImports
          (libcellml *this,ModelPtr *flatModel,UnitsPtr *units,size_t index,ComponentPtr *component)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  string *name;
  element_type *peVar2;
  element_type *this_01;
  int __flags;
  size_t sVar3;
  void *__child_stack;
  string local_b8;
  string local_98;
  UnitsPtr importedUnits;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  ModelPtr importingModelCopy;
  ImportSourcePtr importSource;
  ComponentPtr *component_local;
  size_t index_local;
  UnitsPtr *units_local;
  ModelPtr *flatModel_local;
  
  sVar3 = index;
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             flatModel);
  __flags = (int)sVar3;
  this_00 = &importingModelCopy.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  ImportedEntity::importSource((ImportedEntity *)this_00);
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this_00);
  ImportSource::model((ImportSource *)local_58);
  peVar1 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_58);
  Model::clone((Model *)local_48,(__fn *)peVar1,__child_stack,__flags,component);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_58);
  name = (string *)
         std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_48);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)flatModel);
  ImportedEntity::importReference_abi_cxx11_(&local_98,&peVar2->super_ImportedEntity);
  Model::units((Model *)&stack0xffffffffffffff88,name);
  std::__cxx11::string::~string((string *)&local_98);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&stack0xffffffffffffff88);
  this_01 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)flatModel);
  NamedEntity::name_abi_cxx11_(&local_b8,&this_01->super_NamedEntity);
  NamedEntity::setName(&peVar2->super_NamedEntity,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  peVar1 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  Model::replaceUnits(peVar1,(size_t)units,(UnitsPtr *)&stack0xffffffffffffff88);
  retrieveUnitsDependencies
            ((ModelPtr *)this,(ModelPtr *)local_48,(UnitsPtr *)&stack0xffffffffffffff88,
             (ComponentPtr *)index);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)&stack0xffffffffffffff88);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_48);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)
             &importingModelCopy.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void flattenUnitsImports(const ModelPtr &flatModel, const UnitsPtr &units, size_t index, const ComponentPtr &component)
{
    auto importSource = units->importSource();
    auto importingModelCopy = importSource->model()->clone();
    auto importedUnits = importingModelCopy->units(units->importReference());
    importedUnits->setName(units->name());
    flatModel->replaceUnits(index, importedUnits);
    retrieveUnitsDependencies(flatModel, importingModelCopy, importedUnits, component);
}